

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyRecord.h
# Opt level: O1

bool __thiscall
Js::BuiltInPropertyRecord<9>::Equals(BuiltInPropertyRecord<9> *this,JavascriptString *str)

{
  charcount_t cVar1;
  int iVar2;
  char16 *string2;
  bool bVar3;
  long local_28;
  PropertyRecord *propRecord;
  
  local_28 = 0;
  (*(str->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x61])(str,&local_28,0);
  if (local_28 == 0) {
    string2 = JavascriptString::GetString(str);
    cVar1 = JavascriptString::GetLength(str);
    if (cVar1 == 8) {
      if (this->buffer == string2) {
        bVar3 = true;
      }
      else {
        iVar2 = PAL_wmemcmp(this->buffer,string2,8);
        bVar3 = iVar2 == 0;
      }
    }
    else {
      bVar3 = false;
    }
  }
  else {
    bVar3 = *(int *)(local_28 + 8) == (this->propertyRecord).pid;
  }
  return bVar3;
}

Assistant:

bool Equals(JavascriptString * str) const
        {
            const PropertyRecord * propRecord = nullptr;
            str->GetPropertyRecord(&propRecord);

            if (propRecord == nullptr)
            {
                return Equals(str->GetString(), str->GetLength());
            }
            else
            {
                return Equals(propRecord->GetPropertyId());
            }
        }